

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O3

Vec_Ptr_t * Llb_Nonlin4Group(DdManager *dd,Vec_Ptr_t *vParts,Vec_Int_t *vVars2Q,int nSizeMax)

{
  Llb_Prt_t **ppLVar1;
  Llb_Prt_t *pLVar2;
  DdNode *pDVar3;
  int iVar4;
  int iVar5;
  Llb_Mgr_t_conflict *p;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *local_50;
  Llb_Prt_t *local_48;
  ulong local_40;
  ulong local_38;
  
  p = Llb_Nonlin4Alloc(dd,vParts,(DdNode *)0x0,vVars2Q,nSizeMax);
  uVar10 = p->iPartFree;
  if (0 < (long)(int)uVar10) {
    ppLVar1 = p->pParts;
    lVar15 = 0;
    do {
      pLVar2 = ppLVar1[lVar15];
      if (pLVar2 != (Llb_Prt_t *)0x0) {
        lVar6 = (long)pLVar2->vVars->nSize;
        if (0 < lVar6) {
          lVar13 = 0;
          do {
            if (p->pVars[pLVar2->vVars->pArray[lVar13]]->vParts->nSize == 1) {
              Llb_Nonlin4Quantify1(p,pLVar2);
              break;
            }
            lVar13 = lVar13 + 1;
          } while (lVar6 != lVar13);
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != (int)uVar10);
  }
  Llb_Nonlin4RecomputeScores(p);
  iVar4 = Llb_Nonlin4NextPartitions(p,&local_48,&local_50);
  if (iVar4 != 0) {
    do {
      iVar4 = Cudd_ReadReorderings(dd);
      iVar5 = Llb_Nonlin4Quantify2(p,local_48,local_50);
      if (iVar5 == 0) {
        Llb_Nonlin4Free(p);
        return (Vec_Ptr_t *)0x0;
      }
      iVar5 = Cudd_ReadReorderings(dd);
      if (iVar4 < iVar5) {
        Llb_Nonlin4RecomputeScores(p);
      }
      iVar4 = Llb_Nonlin4NextPartitions(p,&local_48,&local_50);
    } while (iVar4 != 0);
    uVar10 = p->iPartFree;
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(8000);
  pVVar7->pArray = ppvVar8;
  if (0 < (int)uVar10) {
    uVar9 = (ulong)uVar10;
    uVar12 = 0;
    uVar11 = 1000;
    uVar14 = 0;
    local_38 = uVar9;
    do {
      pLVar2 = p->pParts[uVar14];
      if (pLVar2 != (Llb_Prt_t *)0x0) {
        pDVar3 = pLVar2->bFunc;
        if (*(int *)((ulong)pDVar3 & 0xfffffffffffffffe) == 0x7fffffff) {
          if (((ulong)pDVar3 & 1) != 0) {
            __assert_fail("!Cudd_IsComplement(pPart->bFunc)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Image.c"
                          ,0x34a,
                          "Vec_Ptr_t *Llb_Nonlin4Group(DdManager *, Vec_Ptr_t *, Vec_Int_t *, int)")
            ;
          }
        }
        else {
          iVar4 = (int)uVar11;
          if ((int)uVar12 == iVar4) {
            if (iVar4 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = 0x10;
              uVar11 = 0x10;
            }
            else {
              uVar11 = (ulong)(uint)(iVar4 * 2);
              local_40 = uVar12;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(uVar11 * 8);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,uVar11 * 8);
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = iVar4 * 2;
              uVar12 = local_40;
            }
          }
          else {
            ppvVar8 = pVVar7->pArray;
          }
          uVar10 = (int)uVar12 + 1;
          pVVar7->nSize = uVar10;
          ppvVar8[(int)uVar12] = pDVar3;
          Cudd_Ref(pLVar2->bFunc);
          uVar12 = (ulong)uVar10;
          uVar9 = local_38;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar9 != uVar14);
  }
  Llb_Nonlin4Free(p);
  return pVVar7;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4Group( DdManager * dd, Vec_Ptr_t * vParts, Vec_Int_t * vVars2Q, int nSizeMax )
{
    Vec_Ptr_t * vGroups;
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    int i, nReorders;//, clk = Abc_Clock();
    // start the manager
    p = Llb_Nonlin4Alloc( dd, vParts, NULL, vVars2Q, nSizeMax );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_Nonlin4HasSingletonVars(p, pPart) )
            Llb_Nonlin4Quantify1( p, pPart );
    // compute scores
    Llb_Nonlin4RecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_Nonlin4NextPartitions(p, &pPart1, &pPart2) )
    {
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_Nonlin4Quantify2( p, pPart1, pPart2 ) )
        {
            Llb_Nonlin4Free( p );
            return NULL;
        }
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_Nonlin4RecomputeScores( p );
//        else
//            Llb_Nonlin4VerifyScores( p );
    }
    // load partitions
    vGroups = Vec_PtrAlloc( 1000 );
    Llb_MgrForEachPart( p, pPart, i )
    {
//printf( "Iteration %d ", pPart->iPart );
        if ( Cudd_IsConstant(pPart->bFunc) )
        {
//printf( "Constant\n" );
            assert( !Cudd_IsComplement(pPart->bFunc) );
            continue;
        }
//printf( "\n" );
        Vec_PtrPush( vGroups, pPart->bFunc );
        Cudd_Ref( pPart->bFunc );
//printf( "Part %d  ", pPart->iPart );
//Extra_bddPrintSupport( p->dd, pPart->bFunc ); printf( "\n" );
    }
    Llb_Nonlin4Free( p );
//Abc_PrintTime( 1, "Reparametrization time", Abc_Clock() - clk );
    return vGroups;
}